

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::basic_data(basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             *this,value_type *string)

{
  wchar_t *__s;
  pointer __p;
  allocator<wchar_t> local_25 [13];
  wchar_t *local_18;
  value_type *string_local;
  basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *this_local;
  
  this->type_ = string;
  local_18 = string;
  string_local = (value_type *)this;
  std::
  unique_ptr<std::unordered_map<std::__cxx11::wstring,kainjow::mustache::basic_data<std::__cxx11::wstring>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,kainjow::mustache::basic_data<std::__cxx11::wstring>>>>,std::default_delete<std::unordered_map<std::__cxx11::wstring,kainjow::mustache::basic_data<std::__cxx11::wstring>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,kainjow::mustache::basic_data<std::__cxx11::wstring>>>>>>
  ::
  unique_ptr<std::default_delete<std::unordered_map<std::__cxx11::wstring,kainjow::mustache::basic_data<std::__cxx11::wstring>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,kainjow::mustache::basic_data<std::__cxx11::wstring>>>>>,void>
            ((unique_ptr<std::unordered_map<std::__cxx11::wstring,kainjow::mustache::basic_data<std::__cxx11::wstring>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,kainjow::mustache::basic_data<std::__cxx11::wstring>>>>,std::default_delete<std::unordered_map<std::__cxx11::wstring,kainjow::mustache::basic_data<std::__cxx11::wstring>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,kainjow::mustache::basic_data<std::__cxx11::wstring>>>>>>
              *)&this->obj_);
  std::unique_ptr<std::__cxx11::wstring,std::default_delete<std::__cxx11::wstring>>::
  unique_ptr<std::default_delete<std::__cxx11::wstring>,void>
            ((unique_ptr<std::__cxx11::wstring,std::default_delete<std::__cxx11::wstring>> *)
             &this->str_);
  std::
  unique_ptr<std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>>>,std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>>>>,void>
            ((unique_ptr<std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>>>,std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>>>>>
              *)&this->list_);
  std::
  unique_ptr<std::function<std::__cxx11::wstring()>,std::default_delete<std::function<std::__cxx11::wstring()>>>
  ::unique_ptr<std::default_delete<std::function<std::__cxx11::wstring()>>,void>
            ((unique_ptr<std::function<std::__cxx11::wstring()>,std::default_delete<std::function<std::__cxx11::wstring()>>>
              *)&this->partial_);
  std::
  unique_ptr<kainjow::mustache::basic_lambda_t<std::__cxx11::wstring>,std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::wstring>>>
  ::unique_ptr<std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::wstring>>,void>
            ((unique_ptr<kainjow::mustache::basic_lambda_t<std::__cxx11::wstring>,std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::wstring>>>
              *)&this->lambda_);
  __p = (pointer)operator_new(0x20);
  __s = local_18;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)__p,__s,local_25);
  Catch::clara::std::
  unique_ptr<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::default_delete<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::reset(&this->str_,__p);
  std::allocator<wchar_t>::~allocator(local_25);
  return;
}

Assistant:

basic_data(const typename string_type::value_type* string) : type_{type::string} {
        str_.reset(new string_type(string));
    }